

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O3

void incomplete_block_test(void)

{
  fdb_doc *pfVar1;
  double dVar2;
  fdb_status fVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  long in_RCX;
  fdb_kvs_handle **ptr_handle;
  ulong uVar8;
  char cVar9;
  undefined8 unaff_RBP;
  long lVar10;
  char *pcVar11;
  code *__src;
  fdb_doc *unaff_R12;
  fdb_kvs_handle *unaff_R13;
  fdb_kvs_handle *config;
  fdb_doc **ppfVar12;
  double dVar13;
  fdb_doc *rdoc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_kvs_handle *pfStack_870;
  fdb_doc *pfStack_868;
  double dStack_860;
  fdb_kvs_handle *pfStack_858;
  fdb_file_handle *pfStack_850;
  timeval tStack_848;
  fdb_kvs_config fStack_838;
  fdb_doc *apfStack_820 [10];
  double adStack_7d0 [33];
  fdb_config fStack_6c8;
  char acStack_5d0 [264];
  fdb_kvs_handle **ppfStack_4c8;
  fdb_doc *pfStack_4c0;
  fdb_kvs_handle *pfStack_4b8;
  fdb_kvs_handle *pfStack_4b0;
  fdb_doc **ppfStack_4a8;
  code *pcStack_4a0;
  fdb_doc *local_488;
  fdb_kvs_handle *local_480;
  fdb_doc *local_478;
  undefined1 local_470 [40];
  undefined1 local_448 [32];
  filemgr *local_428;
  btreeblk_handle *local_420;
  undefined4 local_40c;
  undefined1 local_401;
  undefined1 local_338 [512];
  fdb_kvs_handle *local_138 [33];
  
  pcStack_4a0 = (code *)0x114735;
  gettimeofday((timeval *)(local_470 + 0x18),(__timezone_ptr_t)0x0);
  pcStack_4a0 = (code *)0x11473a;
  memleak_start();
  local_488 = (fdb_doc *)0x0;
  pcStack_4a0 = (code *)0x11474b;
  system("rm -rf  dummy* > errorlog.txt");
  pcStack_4a0 = (code *)0x114758;
  fdb_get_default_config();
  config = (fdb_kvs_handle *)local_448;
  pcStack_4a0 = (code *)0x114765;
  fdb_get_default_kvs_config();
  local_428 = (filemgr *)0x0;
  local_420 = (btreeblk_handle *)0x400;
  local_40c = 1;
  local_401 = 0;
  ppfVar12 = (fdb_doc **)(local_470 + 0x10);
  pcStack_4a0 = (code *)0x114793;
  fdb_open((fdb_file_handle **)ppfVar12,"./dummy1",(fdb_config *)(local_448 + 0x18));
  ptr_handle = &local_480;
  pcStack_4a0 = (code *)0x1147a6;
  fdb_kvs_open_default((fdb_file_handle *)local_470._16_8_,ptr_handle,(fdb_kvs_config *)config);
  pcStack_4a0 = (code *)0x1147bc;
  fVar3 = fdb_set_log_callback(local_480,logCallbackFunc,"incomplete_block_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    ptr_handle = local_138;
    pcStack_4a0 = (code *)0x1147df;
    sprintf((char *)ptr_handle,"key%d",0);
    unaff_R12 = (fdb_doc *)(local_338 + 0x100);
    pcStack_4a0 = (code *)0x1147fa;
    sprintf((char *)unaff_R12,"meta%d",0);
    unaff_R13 = (fdb_kvs_handle *)local_338;
    pcStack_4a0 = (code *)0x114815;
    sprintf((char *)unaff_R13,"body%d",0);
    pcStack_4a0 = (code *)0x11481d;
    sVar5 = strlen((char *)ptr_handle);
    pcStack_4a0 = (code *)0x114828;
    sVar6 = strlen((char *)unaff_R12);
    pcStack_4a0 = (code *)0x114833;
    sVar7 = strlen((char *)unaff_R13);
    config = (fdb_kvs_handle *)&local_478;
    pcStack_4a0 = (code *)0x114853;
    fdb_doc_create((fdb_doc **)config,ptr_handle,sVar5,unaff_R12,sVar6,unaff_R13,sVar7);
    pcStack_4a0 = (code *)0x114860;
    fdb_set(local_480,local_478);
    pcStack_4a0 = (code *)0x114876;
    sprintf((char *)ptr_handle,"key%d",1);
    pcStack_4a0 = (code *)0x11488c;
    sprintf((char *)unaff_R12,"meta%d",1);
    pcStack_4a0 = (code *)0x1148a2;
    sprintf((char *)unaff_R13,"body%d",1);
    pcStack_4a0 = (code *)0x1148aa;
    sVar5 = strlen((char *)ptr_handle);
    pcStack_4a0 = (code *)0x1148b5;
    sVar6 = strlen((char *)unaff_R12);
    pcStack_4a0 = (code *)0x1148c0;
    sVar7 = strlen((char *)unaff_R13);
    pcStack_4a0 = (code *)0x1148dd;
    fdb_doc_create((fdb_doc **)local_470,ptr_handle,sVar5,unaff_R12,sVar6,unaff_R13,sVar7);
    pcStack_4a0 = (code *)0x1148eb;
    fdb_set(local_480,(fdb_doc *)local_470._0_8_);
    unaff_RBP = CONCAT71((int7)(sVar6 >> 8),1);
    ppfVar12 = &local_488;
    while( true ) {
      in_RCX = 0;
      pcStack_4a0 = (code *)0x114915;
      fdb_doc_create(ppfVar12,(void *)(*(size_t **)&config->kvs_config)[4],
                     **(size_t **)&config->kvs_config,(void *)0x0,0,(void *)0x0,0);
      pcStack_4a0 = (code *)0x114924;
      fVar3 = fdb_get(local_480,local_488);
      pfVar1 = local_488;
      if (fVar3 != FDB_RESULT_SUCCESS) break;
      unaff_R13 = (fdb_kvs_handle *)local_488->meta;
      ptr_handle = *(fdb_kvs_handle ***)&config->kvs_config;
      config = ptr_handle[7];
      pcStack_4a0 = (code *)0x11494d;
      iVar4 = bcmp(unaff_R13,config,local_488->metalen);
      unaff_R12 = pfVar1;
      if (iVar4 != 0) goto LAB_00114a15;
      config = (fdb_kvs_handle *)pfVar1->body;
      unaff_R13 = ptr_handle[8];
      pcStack_4a0 = (code *)0x11496e;
      iVar4 = bcmp(config,unaff_R13,pfVar1->bodylen);
      if (iVar4 != 0) goto LAB_00114a20;
      pcStack_4a0 = (code *)0x11497e;
      fdb_doc_free(pfVar1);
      local_488 = (fdb_doc *)0x0;
      config = (fdb_kvs_handle *)local_470;
      cVar9 = (char)unaff_RBP;
      unaff_RBP = 0;
      if (cVar9 == '\0') {
        pcStack_4a0 = (code *)0x1149a5;
        fdb_kvs_close(local_480);
        pcStack_4a0 = (code *)0x1149af;
        fdb_close((fdb_file_handle *)local_470._16_8_);
        pcStack_4a0 = (code *)0x1149b9;
        fdb_doc_free(local_478);
        pcStack_4a0 = (code *)0x1149c3;
        fdb_doc_free((fdb_doc *)local_470._0_8_);
        pcStack_4a0 = (code *)0x1149c8;
        fdb_shutdown();
        pcStack_4a0 = (code *)0x1149cd;
        memleak_end();
        pcVar11 = "%s PASSED\n";
        if (incomplete_block_test()::__test_pass != '\0') {
          pcVar11 = "%s FAILED\n";
        }
        pcStack_4a0 = (code *)0x1149fe;
        fprintf(_stderr,pcVar11,"incomplete block test");
        return;
      }
    }
    pcStack_4a0 = (code *)0x114a15;
    incomplete_block_test();
LAB_00114a15:
    pcStack_4a0 = (code *)0x114a20;
    incomplete_block_test();
LAB_00114a20:
    pcStack_4a0 = (code *)0x114a2b;
    incomplete_block_test();
  }
  pcStack_4a0 = custom_compare_primitive_test;
  incomplete_block_test();
  uVar8 = 0;
  ppfStack_4c8 = ptr_handle;
  pfStack_4c0 = unaff_R12;
  pfStack_4b8 = unaff_R13;
  pfStack_4b0 = config;
  ppfStack_4a8 = ppfVar12;
  pcStack_4a0 = (code *)unaff_RBP;
  gettimeofday(&tStack_848,(__timezone_ptr_t)0x0);
  memleak_start();
  pfStack_868 = (fdb_doc *)0x0;
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fStack_6c8.buffercache_size = 0;
  fStack_6c8.wal_threshold = 0x400;
  fStack_6c8.flags = 1;
  fStack_6c8.compaction_threshold = '\0';
  fStack_6c8.multi_kv_instances = true;
  fStack_838.custom_cmp = _cmp_double;
  fdb_open(&pfStack_850,"./dummy1",&fStack_6c8);
  fdb_kvs_open_default(pfStack_850,&pfStack_858,&fStack_838);
  __src = logCallbackFunc;
  fVar3 = fdb_set_log_callback(pfStack_858,logCallbackFunc,"custom_compare_primitive_test");
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00114e46;
  ppfVar12 = apfStack_820;
  lVar10 = 0;
  do {
    dVar13 = 10000.0 / (double)(int)lVar10;
    adStack_7d0[0] = dVar13;
    sprintf(acStack_5d0,"value: %d, %f",dVar13,uVar8);
    sVar5 = strlen(acStack_5d0);
    fdb_doc_create(ppfVar12,adStack_7d0,8,(void *)0x0,0,acStack_5d0,sVar5 + 1);
    fdb_set(pfStack_858,*ppfVar12);
    lVar10 = lVar10 + 0xb;
    uVar8 = (ulong)((int)uVar8 + 1);
    ppfVar12 = ppfVar12 + 1;
  } while (lVar10 != 0x6e);
  in_RCX = 0;
  dStack_860 = dVar13;
  fdb_iterator_init(pfStack_858,(fdb_iterator **)&pfStack_870,(void *)0x0,0,(void *)0x0,0,0);
  dVar13 = -1.0;
  do {
    __src = (code *)&pfStack_868;
    fVar3 = fdb_iterator_get((fdb_iterator *)pfStack_870,&pfStack_868);
    pfVar1 = pfStack_868;
    if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_00114e2d:
      custom_compare_primitive_test();
      goto LAB_00114e32;
    }
    __src = (code *)pfStack_868->key;
    memcpy(&dStack_860,__src,pfStack_868->keylen);
    dVar2 = dStack_860;
    if (dStack_860 <= dVar13) {
      custom_compare_primitive_test();
      goto LAB_00114e2d;
    }
    fdb_doc_free(pfVar1);
    pfStack_868 = (fdb_doc *)0x0;
    fVar3 = fdb_iterator_next((fdb_iterator *)pfStack_870);
    dVar13 = dVar2;
  } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
  fdb_iterator_close((fdb_iterator *)pfStack_870);
  fdb_commit(pfStack_850,'\x01');
  in_RCX = 0;
  fdb_iterator_init(pfStack_858,(fdb_iterator **)&pfStack_870,(void *)0x0,0,(void *)0x0,0,0);
  dVar13 = -1.0;
  do {
    __src = (code *)&pfStack_868;
    fVar3 = fdb_iterator_get((fdb_iterator *)pfStack_870,&pfStack_868);
    pfVar1 = pfStack_868;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00114e37;
    __src = (code *)pfStack_868->key;
    memcpy(&dStack_860,__src,pfStack_868->keylen);
    dVar2 = dStack_860;
    if (dStack_860 <= dVar13) goto LAB_00114e32;
    fdb_doc_free(pfVar1);
    pfStack_868 = (fdb_doc *)0x0;
    fVar3 = fdb_iterator_next((fdb_iterator *)pfStack_870);
    dVar13 = dVar2;
  } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
  fdb_iterator_close((fdb_iterator *)pfStack_870);
  fdb_compact(pfStack_850,"./dummy2");
  in_RCX = 0;
  fdb_iterator_init(pfStack_858,(fdb_iterator **)&pfStack_870,(void *)0x0,0,(void *)0x0,0,0);
  dVar13 = -1.0;
  while (__src = (code *)&pfStack_868,
        fVar3 = fdb_iterator_get((fdb_iterator *)pfStack_870,&pfStack_868), pfVar1 = pfStack_868,
        fVar3 == FDB_RESULT_SUCCESS) {
    __src = (code *)pfStack_868->key;
    memcpy(&dStack_860,__src,pfStack_868->keylen);
    dVar2 = dStack_860;
    if (dStack_860 <= dVar13) goto LAB_00114e3c;
    fdb_doc_free(pfVar1);
    pfStack_868 = (fdb_doc *)0x0;
    fVar3 = fdb_iterator_next((fdb_iterator *)pfStack_870);
    dVar13 = dVar2;
    if (fVar3 == FDB_RESULT_ITERATOR_FAIL) {
      fdb_iterator_close((fdb_iterator *)pfStack_870);
      fdb_kvs_close(pfStack_858);
      fdb_close(pfStack_850);
      lVar10 = 0;
      do {
        fdb_doc_free(apfStack_820[lVar10]);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 10);
      fdb_shutdown();
      memleak_end();
      pcVar11 = "%s PASSED\n";
      if (custom_compare_primitive_test()::__test_pass != '\0') {
        pcVar11 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar11,"custom compare function for primitive key test");
      return;
    }
  }
  goto LAB_00114e41;
LAB_00114e32:
  custom_compare_primitive_test();
LAB_00114e37:
  custom_compare_primitive_test();
LAB_00114e3c:
  custom_compare_primitive_test();
LAB_00114e41:
  custom_compare_primitive_test();
LAB_00114e46:
  custom_compare_primitive_test();
  if (((fdb_doc **)__src != (fdb_doc **)0x0) && (in_RCX == 0)) {
    return;
  }
  return;
}

Assistant:

void incomplete_block_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 2;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "incomplete_block_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // retrieve documents
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        // updated documents
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        // free result document
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("incomplete block test");
}